

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4837a::lower_instructions_visitor::div_to_mul_rcp
          (lower_instructions_visitor *this,ir_expression *ir)

{
  bool bVar1;
  ir_expression *this_00;
  ir_rvalue *expr;
  ir_expression *ir_local;
  lower_instructions_visitor *this_local;
  
  bVar1 = glsl_type::is_float_16_32_64(ir->operands[1]->type);
  if (!bVar1) {
    __assert_fail("ir->operands[1]->type->is_float_16_32_64()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_instructions.cpp"
                  ,0xd5,
                  "void (anonymous namespace)::lower_instructions_visitor::div_to_mul_rcp(ir_expression *)"
                 );
  }
  this_00 = (ir_expression *)exec_node::operator_new(0x58,ir);
  ir_expression::ir_expression
            (this_00,5,ir->operands[1]->type,ir->operands[1],(ir_rvalue *)0x0,(ir_rvalue *)0x0,
             (ir_rvalue *)0x0);
  ir->operation = ir_binop_mul;
  ir_expression::init_num_operands(ir);
  ir->operands[1] = (ir_rvalue *)this_00;
  (this->super_ir_hierarchical_visitor).field_0x31 = 1;
  return;
}

Assistant:

void
lower_instructions_visitor::div_to_mul_rcp(ir_expression *ir)
{
   assert(ir->operands[1]->type->is_float_16_32_64());

   /* New expression for the 1.0 / op1 */
   ir_rvalue *expr;
   expr = new(ir) ir_expression(ir_unop_rcp,
				ir->operands[1]->type,
				ir->operands[1]);

   /* op0 / op1 -> op0 * (1.0 / op1) */
   ir->operation = ir_binop_mul;
   ir->init_num_operands();
   ir->operands[1] = expr;

   this->progress = true;
}